

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

void __thiscall
pbrt::SurfaceInteraction::ComputeDifferentials
          (SurfaceInteraction *this,RayDifferential *ray,CameraHandle *camera,int samplesPerPixel)

{
  Normal3f *n;
  Vector3f *pVVar1;
  Vector3f *pVVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int line;
  char *args;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  type tVar14;
  type tVar15;
  type tVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar27 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar28 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Point3f PVar35;
  Vector3<float> VVar36;
  Point3<float> PVar37;
  undefined1 local_b8 [16];
  Tuple3<pbrt::Vector3,_float> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar29 [56];
  
  if (ray->hasDifferentials == true) {
    n = &(this->super_Interaction).n;
    pVVar1 = &ray->rxDirection;
    tVar14 = Dot<float>(n,pVVar1);
    if ((tVar14 != 0.0) || (NAN(tVar14))) {
      pVVar2 = &ray->ryDirection;
      tVar14 = Dot<float>(n,pVVar2);
      if ((tVar14 != 0.0) || (NAN(tVar14))) {
        auVar29 = extraout_var_01;
        PVar35 = Interaction::p(&this->super_Interaction);
        local_98.z = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
        auVar20._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar20._8_56_ = auVar29;
        local_98._0_8_ = vmovlps_avx(auVar20._0_16_);
        tVar14 = Dot<float>(n,(Vector3<float> *)&local_98);
        local_98.z = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        local_98.x = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        local_98.y = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        tVar15 = Dot<float>(n,(Vector3<float> *)&local_98);
        local_88._0_4_ = tVar14 - tVar15;
        tVar15 = Dot<float>(n,pVVar1);
        auVar29 = ZEXT856(0);
        if (0x7f7fffff < (uint)ABS((float)local_88._0_4_ / tVar15)) {
          args = "!IsInf(tx) && !IsNaN(tx)";
          line = 0x32;
LAB_00301b47:
          LogFatal<char_const(&)[25]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/interaction.cpp"
                     ,line,"Check failed: %s",(char (*) [25])args);
        }
        VVar36 = Tuple3<pbrt::Vector3,float>::operator*
                           ((Tuple3<pbrt::Vector3,float> *)pVVar1,(float)local_88._0_4_ / tVar15);
        local_98.z = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar21._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar21._8_56_ = auVar29;
        local_98._0_8_ = vmovlpd_avx(auVar21._0_16_);
        PVar37 = Point3<float>::operator+(&ray->rxOrigin,(Vector3<float> *)&local_98);
        auVar22._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar22._8_56_ = auVar29;
        local_88 = auVar22._0_16_;
        local_98.z = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        local_98.x = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        local_98.y = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        local_78._0_4_ = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
        tVar15 = Dot<float>(n,(Vector3<float> *)&local_98);
        tVar16 = Dot<float>(n,pVVar2);
        fVar17 = (tVar14 - tVar15) / tVar16;
        auVar29 = ZEXT856(0);
        if (0x7f7fffff < (uint)ABS(fVar17)) {
          args = "!IsInf(ty) && !IsNaN(ty)";
          line = 0x35;
          goto LAB_00301b47;
        }
        VVar36 = Tuple3<pbrt::Vector3,float>::operator*
                           ((Tuple3<pbrt::Vector3,float> *)pVVar2,fVar17);
        local_98.z = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar23._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar23._8_56_ = auVar29;
        local_98._0_8_ = vmovlpd_avx(auVar23._0_16_);
        PVar37 = Point3<float>::operator+(&ray->ryOrigin,(Vector3<float> *)&local_98);
        auVar24._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar24._8_56_ = auVar29;
        PVar35 = Interaction::p(&this->super_Interaction);
        auVar25._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar25._8_56_ = auVar29;
        auVar13 = vsubps_avx(local_88,auVar25._0_16_);
        auVar29 = ZEXT856(auVar13._8_8_);
        uVar3 = vmovlps_avx(auVar13);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z =
             (float)local_78._0_4_ - PVar35.super_Tuple3<pbrt::Point3,_float>.z;
        PVar35 = Interaction::p(&this->super_Interaction);
        auVar26._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar26._8_56_ = auVar29;
        auVar13 = vsubps_avx(auVar24._0_16_,auVar26._0_16_);
        uVar3 = vmovlps_avx(auVar13);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z =
             PVar37.super_Tuple3<pbrt::Point3,_float>.z - PVar35.super_Tuple3<pbrt::Point3,_float>.z
        ;
        goto LAB_00301989;
      }
    }
  }
  CameraHandle::ApproximatedPdxy(camera,this,samplesPerPixel);
LAB_00301989:
  pVVar1 = &this->dpdu;
  local_b8._0_4_ = Dot<float>(pVVar1,pVVar1);
  pVVar2 = &this->dpdv;
  local_b8._4_4_ = extraout_XMM0_Db;
  local_b8._8_4_ = extraout_XMM0_Dc;
  local_b8._12_4_ = extraout_XMM0_Dd;
  fVar18 = Dot<float>(pVVar1,pVVar2);
  auVar27._0_4_ = Dot<float>(pVVar2,pVVar2);
  auVar27._4_60_ = extraout_var;
  auVar9._4_4_ = extraout_XMM0_Db_00;
  auVar9._0_4_ = fVar18;
  auVar9._8_4_ = extraout_XMM0_Dc_00;
  auVar9._12_4_ = extraout_XMM0_Dd_00;
  local_88 = auVar27._0_16_;
  auVar13 = vfmsub132ss_fma(local_88,ZEXT416((uint)(fVar18 * fVar18)),ZEXT416((uint)local_b8._0_4_))
  ;
  auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),auVar9,auVar9);
  fVar17 = 1.0 / (auVar13._0_4_ + auVar10._0_4_);
  local_78 = ZEXT416((uint)fVar17);
  local_48 = Dot<float>(pVVar1,&this->dpdx);
  local_58 = Dot<float>(pVVar2,&this->dpdx);
  uStack_54 = extraout_XMM0_Db_01;
  uStack_50 = extraout_XMM0_Dc_01;
  uStack_4c = extraout_XMM0_Dd_01;
  local_68 = Dot<float>(pVVar1,&this->dpdy);
  auVar28._0_4_ = Dot<float>(pVVar2,&this->dpdy);
  auVar28._4_60_ = extraout_var_00;
  auVar12._4_4_ = uStack_54;
  auVar12._0_4_ = local_58;
  auVar12._8_4_ = uStack_50;
  auVar12._12_4_ = uStack_4c;
  auVar34._8_8_ = 0x400000000;
  auVar34._0_8_ = 0x400000000;
  auVar30._4_4_ = fVar18;
  auVar30._0_4_ = fVar18;
  auVar30._8_4_ = fVar18;
  auVar30._12_4_ = fVar18;
  auVar13 = vinsertps_avx(auVar12,ZEXT416((uint)local_48),0x10);
  auVar12 = vpermi2ps_avx512vl(auVar34,local_88,local_b8);
  fVar17 = (float)((uint)((uint)ABS(fVar17) < 0x7f800000) * local_78._0_4_);
  auVar13 = vinsertps_avx(auVar13,auVar28._0_16_,0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)local_68),0x30);
  auVar32._0_4_ = fVar18 * auVar13._0_4_;
  auVar32._4_4_ = fVar18 * auVar13._4_4_;
  auVar32._8_4_ = fVar18 * auVar13._8_4_;
  auVar32._12_4_ = fVar18 * auVar13._12_4_;
  auVar10 = vshufps_avx(auVar13,auVar13,0xb1);
  auVar9 = vfnmadd213ps_fma(auVar13,auVar30,auVar32);
  auVar31._8_4_ = 0xccbebc20;
  auVar31._0_8_ = 0xccbebc20ccbebc20;
  auVar31._12_4_ = 0xccbebc20;
  auVar13 = vfmsub213ps_fma(auVar10,auVar12,auVar32);
  auVar33._8_4_ = 0x4cbebc20;
  auVar33._0_8_ = 0x4cbebc204cbebc20;
  auVar33._12_4_ = 0x4cbebc20;
  auVar19._0_4_ = fVar17 * (auVar13._0_4_ + auVar9._0_4_);
  auVar19._4_4_ = fVar17 * (auVar13._4_4_ + auVar9._4_4_);
  auVar19._8_4_ = fVar17 * (auVar13._8_4_ + auVar9._8_4_);
  auVar19._12_4_ = fVar17 * (auVar13._12_4_ + auVar9._12_4_);
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(auVar19,auVar13);
  auVar10._8_4_ = 0x7f800000;
  auVar10._0_8_ = 0x7f8000007f800000;
  auVar10._12_4_ = 0x7f800000;
  uVar11 = vpcmpd_avx512vl(auVar13,auVar10,1);
  uVar11 = uVar11 & 0xf;
  uVar8 = vcmpps_avx512vl(auVar19,auVar31,1);
  auVar13 = vminps_avx(auVar33,auVar19);
  bVar4 = (bool)((byte)uVar8 & 1);
  bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
  bVar6 = (bool)((byte)(uVar8 >> 2) & 1);
  bVar7 = (bool)((byte)(uVar8 >> 3) & 1);
  this->dudx = (Float)((uint)((byte)uVar11 & 1) *
                      ((uint)bVar4 * -0x334143e0 | (uint)!bVar4 * auVar13._0_4_));
  this->dvdx = (Float)((uint)((byte)(uVar11 >> 1) & 1) *
                      ((uint)bVar5 * -0x334143e0 | (uint)!bVar5 * auVar13._4_4_));
  this->dudy = (Float)((uint)((byte)(uVar11 >> 2) & 1) *
                      ((uint)bVar6 * -0x334143e0 | (uint)!bVar6 * auVar13._8_4_));
  this->dvdy = (Float)((uint)(byte)(uVar11 >> 3) *
                      ((uint)bVar7 * -0x334143e0 | (uint)!bVar7 * auVar13._12_4_));
  return;
}

Assistant:

void SurfaceInteraction::ComputeDifferentials(const RayDifferential &ray,
                                              CameraHandle camera, int samplesPerPixel) {
    if (ray.hasDifferentials && Dot(n, ray.rxDirection) != 0 &&
        Dot(n, ray.ryDirection) != 0) {
        // Estimate screen-space change in $\pt{}$
        // Compute auxiliary intersection points with plane, _px_ and _py_
        Float d = -Dot(n, Vector3f(p()));
        Float tx = (-Dot(n, Vector3f(ray.rxOrigin)) - d) / Dot(n, ray.rxDirection);
        CHECK(!IsInf(tx) && !IsNaN(tx));
        Point3f px = ray.rxOrigin + tx * ray.rxDirection;
        Float ty = (-Dot(n, Vector3f(ray.ryOrigin)) - d) / Dot(n, ray.ryDirection);
        CHECK(!IsInf(ty) && !IsNaN(ty));
        Point3f py = ray.ryOrigin + ty * ray.ryDirection;

        dpdx = px - p();
        dpdy = py - p();

    } else
        camera.ApproximatedPdxy(*this, samplesPerPixel);
    // Estimate screen-space change in $(u,v)$
    Float a00 = Dot(dpdu, dpdu), a01 = Dot(dpdu, dpdv), a11 = Dot(dpdv, dpdv);
    Float invDet = 1 / (DifferenceOfProducts(a00, a11, a01, a01));

    Float b0x = Dot(dpdu, dpdx), b1x = Dot(dpdv, dpdx);
    Float b0y = Dot(dpdu, dpdy), b1y = Dot(dpdv, dpdy);

    /* Set the UV partials to zero if dpdu and/or dpdv == 0 */
    invDet = std::isfinite(invDet) ? invDet : 0.f;

    dudx = DifferenceOfProducts(a11, b0x, a01, b1x) * invDet;
    dvdx = DifferenceOfProducts(a00, b1x, a01, b0x) * invDet;

    dudy = DifferenceOfProducts(a11, b0y, a01, b1y) * invDet;
    dvdy = DifferenceOfProducts(a00, b1y, a01, b0y) * invDet;

    dudx = std::isfinite(dudx) ? Clamp(dudx, -1e8f, 1e8f) : 0.f;
    dvdx = std::isfinite(dvdx) ? Clamp(dvdx, -1e8f, 1e8f) : 0.f;
    dudy = std::isfinite(dudy) ? Clamp(dudy, -1e8f, 1e8f) : 0.f;
    dvdy = std::isfinite(dvdy) ? Clamp(dvdy, -1e8f, 1e8f) : 0.f;
}